

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckSanitizerOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *result)

{
  pointer piVar1;
  pointer piVar2;
  pointer pbVar3;
  bool bVar4;
  uint uVar5;
  size_type sVar6;
  ostream *poVar7;
  int iVar8;
  string *this_00;
  pointer s;
  string resultFound;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string regex;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  RegularExpression leakWarning;
  RegularExpression sanitizerWarning;
  ostringstream ostr;
  
  regex._M_dataplus._M_p = (pointer)&regex.field_2;
  regex._M_string_length = 0;
  regex.field_2._M_local_buf[0] = '\0';
  uVar5 = this->MemoryTesterStyle - 4;
  if ((uVar5 < 5) && ((0x1dU >> (uVar5 & 0x1f) & 1) != 0)) {
    std::__cxx11::string::assign((char *)&regex);
  }
  cmsys::RegularExpression::RegularExpression(&sanitizerWarning,&regex);
  cmsys::RegularExpression::RegularExpression(&leakWarning,"(Direct|Indirect) leak of .*");
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::SystemTools::Split(str,&lines);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
  pbVar3 = lines.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  log->_M_string_length = 0;
  *(log->_M_dataplus)._M_p = '\0';
  iVar8 = 0;
  s = lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (s == pbVar3) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)log,(string *)&resultFound);
      std::__cxx11::string::~string((string *)&resultFound);
      this->DefectCount = this->DefectCount + iVar8;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&lines);
      cmsys::RegularExpression::~RegularExpression(&leakWarning);
      cmsys::RegularExpression::~RegularExpression(&sanitizerWarning);
      std::__cxx11::string::~string((string *)&regex);
      return iVar8 == 0;
    }
    resultFound._M_dataplus._M_p = (pointer)&resultFound.field_2;
    resultFound._M_string_length = 0;
    resultFound.field_2._M_local_buf[0] = '\0';
    bVar4 = cmsys::RegularExpression::find(&leakWarning,s);
    if (bVar4) {
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_388,&leakWarning.regmatch,1);
      std::operator+(&local_368,&local_388," leak");
      std::__cxx11::string::operator=((string *)&resultFound,(string *)&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      this_00 = &local_388;
LAB_00178ad7:
      std::__cxx11::string::~string((string *)this_00);
    }
    else {
      bVar4 = cmsys::RegularExpression::find(&sanitizerWarning,s);
      if (bVar4) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_368,&sanitizerWarning.regmatch,1);
        std::__cxx11::string::operator=((string *)&resultFound,(string *)&local_368);
        this_00 = &local_368;
        goto LAB_00178ad7;
      }
    }
    if (resultFound._M_string_length != 0) {
      sVar6 = FindOrAddWarning(this,&resultFound);
      piVar1 = (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((piVar1 == piVar2) || (((long)piVar2 - (long)piVar1 >> 2) - 1U < sVar6)) {
        local_368._M_dataplus._M_p._0_4_ = 1;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(result,(int *)&local_368);
      }
      else {
        piVar1[sVar6] = piVar1[sVar6] + 1;
      }
      poVar7 = std::operator<<((ostream *)&ostr,"<b>");
      poVar7 = std::operator<<(poVar7,(string *)
                                      ((this->ResultStrings).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + sVar6));
      std::operator<<(poVar7,"</b> ");
      iVar8 = iVar8 + 1;
    }
    poVar7 = std::operator<<((ostream *)&ostr,(string *)s);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::string::~string((string *)&resultFound);
    s = s + 1;
  } while( true );
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckSanitizerOutput(
  const std::string& str, std::string& log, std::vector<int>& result)
{
  std::string regex;
  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
      regex = "ERROR: AddressSanitizer: (.*) on.*";
      break;
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
      // use leakWarning regex
      break;
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
      regex = "WARNING: ThreadSanitizer: (.*) \\(pid=.*\\)";
      break;
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
      regex = "WARNING: MemorySanitizer: (.*)";
      break;
    case cmCTestMemCheckHandler::UB_SANITIZER:
      regex = "runtime error: (.*)";
      break;
    default:
      break;
  }
  cmsys::RegularExpression sanitizerWarning(regex);
  cmsys::RegularExpression leakWarning("(Direct|Indirect) leak of .*");
  int defects = 0;
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  std::ostringstream ostr;
  log.clear();
  for (std::string const& l : lines) {
    std::string resultFound;
    if (leakWarning.find(l)) {
      resultFound = leakWarning.match(1) + " leak";
    } else if (sanitizerWarning.find(l)) {
      resultFound = sanitizerWarning.match(1);
    }
    if (!resultFound.empty()) {
      std::vector<int>::size_type idx = this->FindOrAddWarning(resultFound);
      if (result.empty() || idx > result.size() - 1) {
        result.push_back(1);
      } else {
        result[idx]++;
      }
      defects++;
      ostr << "<b>" << this->ResultStrings[idx] << "</b> ";
    }
    ostr << l << std::endl;
  }
  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}